

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

bool __thiscall GameBoard::canPut(GameBoard *this,int color,int blockType)

{
  bool bVar1;
  int o;
  int o_00;
  uint y;
  uint x;
  bool bVar2;
  Tetris t;
  bool local_65;
  Tetris local_58;
  
  local_58.shape = blockShape[blockType];
  local_65 = true;
  x = 0x14;
  local_58.gameBoard = this;
  local_58.blockType = blockType;
  local_58.color = color;
  do {
    y = 1;
    bVar2 = false;
    do {
      o_00 = 0;
      do {
        local_58.blockX = x;
        local_58.blockY = y;
        local_58.orientation = o_00;
        bVar1 = Tetris::isValid(&local_58,-1,-1,-1);
        if ((bVar1) && (bVar1 = checkDirectDropTo(this,color,blockType,x,y,o_00), bVar1)) {
          if (!bVar2) {
            return local_65;
          }
          goto LAB_00118208;
        }
        o_00 = o_00 + 1;
      } while (o_00 != 4);
      bVar2 = 9 < y;
      y = y + 1;
    } while (y != 0xb);
LAB_00118208:
    local_65 = 1 < x;
    x = x - 1;
    if (!local_65) {
      return local_65;
    }
  } while( true );
}

Assistant:

bool GameBoard::canPut(int color, int blockType)
{
    Tetris t(this, blockType, color);
    for (int x = MAPHEIGHT; x >= 1; x--)
        for (int y = 1; y <= MAPWIDTH; y++)
            for (int o = 0; o < 4; o++) {
                t.set(x, y, o);
                if (t.isValid() && checkDirectDropTo(color, blockType, x, y, o))
                    return true;
            }
    return false;
}